

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata_writer.cpp
# Opt level: O3

void __thiscall
duckdb::MetadataWriter::WriteData(MetadataWriter *this,const_data_ptr_t buffer,idx_t write_size)

{
  idx_t iVar1;
  data_ptr_t pdVar2;
  ulong uVar3;
  idx_t iVar4;
  size_t __n;
  
  iVar1 = this->offset;
  uVar3 = iVar1 + write_size;
  iVar4 = this->capacity;
  while (iVar4 < uVar3) {
    __n = iVar4 - iVar1;
    if (__n != 0) {
      pdVar2 = BasePtr(this);
      switchD_015de399::default(pdVar2 + this->offset,buffer,__n);
      buffer = buffer + __n;
      this->offset = this->offset + __n;
      write_size = write_size - __n;
    }
    NextBlock(this);
    iVar1 = this->offset;
    uVar3 = iVar1 + write_size;
    iVar4 = this->capacity;
  }
  pdVar2 = BasePtr(this);
  switchD_015de399::default(pdVar2 + this->offset,buffer,write_size);
  this->offset = this->offset + write_size;
  return;
}

Assistant:

void MetadataWriter::WriteData(const_data_ptr_t buffer, idx_t write_size) {
	while (offset + write_size > capacity) {
		// we need to make a new block
		// first copy what we can
		D_ASSERT(offset <= capacity);
		idx_t copy_amount = capacity - offset;
		if (copy_amount > 0) {
			memcpy(Ptr(), buffer, copy_amount);
			buffer += copy_amount;
			offset += copy_amount;
			write_size -= copy_amount;
		}
		// move forward to the next block
		NextBlock();
	}
	memcpy(Ptr(), buffer, write_size);
	offset += write_size;
}